

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O2

void __thiscall
agge::tests::VectorRasterizerTests::NegativeOffsetXIntraCellVerticalLinesProduceNegativeCoverAndArea
          (VectorRasterizerTests *this)

{
  cell reference3 [1];
  cell reference2 [1];
  cell reference1 [1];
  vector_rasterizer vr;
  allocator local_f9;
  cell local_f8;
  cell local_e8;
  string local_d8;
  LocationInfo local_b8;
  cell local_90;
  vector_rasterizer local_80;
  
  vector_rasterizer::vector_rasterizer(&local_80);
  vector_rasterizer::line(&local_80,0xf1a,0xa1a,0xf1a,0xa0d);
  local_90.x = 0xf;
  local_90.y = 10;
  local_90.area = -0x2a4;
  local_90.cover = -0xd;
  std::__cxx11::string::string
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,(allocator *)&local_e8);
  ut::LocationInfo::LocationInfo(&local_b8,&local_d8,0x1da);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])&local_90,&local_80._cells,&local_b8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::reset(&local_80);
  vector_rasterizer::line(&local_80,0x352c,0x900,0x352c,0x800);
  local_e8.x = 0x35;
  local_e8.y = 8;
  local_e8.area = -0x5800;
  local_e8.cover = -0x100;
  std::__cxx11::string::string
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,(allocator *)&local_f8);
  ut::LocationInfo::LocationInfo(&local_b8,&local_d8,0x1e7);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])&local_e8,&local_80._cells,&local_b8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::reset(&local_80);
  vector_rasterizer::line(&local_80,-0xbb8c0,-0x9cd,-0xbb8c0,-0xa00);
  local_f8.x = -0xbb9;
  local_f8.y = -10;
  local_f8.area = -0x1980;
  local_f8.cover = -0x33;
  std::__cxx11::string::string
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_f9);
  ut::LocationInfo::LocationInfo(&local_b8,&local_d8,500);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])&local_f8,&local_80._cells,&local_b8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::~vector_rasterizer(&local_80);
  return;
}

Assistant:

test( NegativeOffsetXIntraCellVerticalLinesProduceNegativeCoverAndArea )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				vr.line(fp(15.1), fp(10.1), fp(15.1), fp(10.05));

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 15, 10, -676, -13 },
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(fp(53.172), fp(9.0), fp(53.172), fp(8.0));

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 53, 8, -22528, -256 },
				};

				assert_equal(reference2, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(fp(-3000.75), fp(-9.8), fp(-3000.75), fp(-10.0));

				// ASSERT
				const vector_rasterizer::cell reference3[] = {
					{ -3001, -10, -6528, -51 },
				};

				assert_equal(reference3, vr.cells());
			}